

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::InteractionUniformBuffers2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionUniformBuffers2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  test_var_type tVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *pTVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  GLuint buffer_object_id;
  undefined4 uStack_194;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  string uniform_use;
  string uniform_definition;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  GLfloat buffer_data [16];
  long lVar4;
  
  iVar2 = (*((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>).
             super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.context_id)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  lVar7 = 0;
  while (supported_variable_types_map._16_8_ != 0) {
    tVar1 = test_shader_compilation::var_types_set_gl[lVar7];
    lVar8 = 0x21f1cb8;
    lVar6 = supported_variable_types_map._16_8_;
    do {
      if ((int)tVar1 <= *(int *)(lVar6 + 0x20)) {
        lVar8 = lVar6;
      }
      lVar6 = *(long *)(lVar6 + 0x10 + (ulong)(*(int *)(lVar6 + 0x20) < (int)tVar1) * 8);
    } while (lVar6 != 0);
    if ((lVar8 == 0x21f1cb8) || ((int)tVar1 < *(int *)(lVar8 + 0x20))) break;
    uniform_definition._M_dataplus._M_p = (pointer)&uniform_definition.field_2;
    uniform_definition._M_string_length = 0;
    uniform_definition.field_2._M_local_buf[0] = '\0';
    uniform_use._M_dataplus._M_p = (pointer)&uniform_use.field_2;
    uniform_use._M_string_length = 0;
    uniform_use.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)&uniform_definition);
    std::__cxx11::string::append((char *)&uniform_definition);
    std::__cxx11::string::_M_append((char *)&uniform_definition,*(ulong *)(lVar8 + 0x28));
    std::__cxx11::string::append((char *)&uniform_definition);
    std::__cxx11::string::_M_replace
              ((ulong)&uniform_use,0,(char *)uniform_use._M_string_length,0x1add70c);
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>::prepare_compute_shader
              ((string *)buffer_data,
               &this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>,
               tested_shader_type,&uniform_definition,&uniform_use);
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>::prepare_fragment_shader
              ((string *)&buffer_object_id,
               &this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>,
               tested_shader_type,&uniform_definition,&uniform_use);
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>::prepare_geometry_shader
              (&local_d8,&this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>,
               tested_shader_type,&uniform_definition,&uniform_use);
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>::prepare_tess_ctrl_shader
              (&local_f8,&this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>,
               tested_shader_type,&uniform_definition,&uniform_use);
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>::prepare_tess_eval_shader
              (&local_118,&this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>,
               tested_shader_type,&uniform_definition,&uniform_use);
    InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>::prepare_vertex_shader
              (&local_138,&this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>,
               tested_shader_type,&uniform_definition,&uniform_use);
    if (tested_shader_type - COMPUTE_SHADER_TYPE < 4) {
      (*(this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>).
        super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.super_TestCase.super_TestNode.
        _vptr_TestNode[10])
                (this,&local_138,&local_f8,&local_118,&local_d8,&buffer_object_id,buffer_data,0,0);
    }
    else {
      if (VERTEX_SHADER_TYPE < tested_shader_type) {
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x1b43);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (*(this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>).
        super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.super_TestCase.super_TestNode.
        _vptr_TestNode[9])(this,&local_138,&buffer_object_id,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_194,buffer_object_id) != &local_188) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_194,buffer_object_id),local_188._M_allocated_capacity + 1);
    }
    if ((GLfloat *)CONCAT44(buffer_data[1],buffer_data[0]) != buffer_data + 4) {
      operator_delete((GLfloat *)CONCAT44(buffer_data[1],buffer_data[0]),buffer_data._16_8_ + 1);
    }
    buffer_object_id = 0;
    (**(code **)(lVar4 + 0x1680))
              ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>).
               super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.program_object_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glUseProgram() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b55);
    iVar2 = (**(code **)(lVar4 + 0xb38))
                      ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>).
                       super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.program_object_id,
                       "uniform_block_name");
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGetUniformBlockIndex() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,7000);
    if (iVar2 == -1) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Uniform block not found or is considered as not active.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1b5c);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar4 + 0x6c8))(1,&buffer_object_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGenBuffers() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b60);
    (**(code **)(lVar4 + 0x40))(0x8a11,buffer_object_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBindBuffer() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b63);
    buffer_data[0xc] = 12.0;
    buffer_data[0xd] = 13.0;
    buffer_data[0xe] = 14.0;
    buffer_data[0xf] = 15.0;
    buffer_data[8] = 8.0;
    buffer_data[9] = 9.0;
    buffer_data[10] = 10.0;
    buffer_data[0xb] = 11.0;
    buffer_data[4] = 4.0;
    buffer_data[5] = 5.0;
    buffer_data[6] = 6.0;
    buffer_data[7] = 7.0;
    buffer_data[0] = 0.0;
    buffer_data[1] = 1.0;
    buffer_data[2] = 2.0;
    buffer_data[3] = 3.0;
    (**(code **)(lVar4 + 0x150))(0x8a11,0x40,buffer_data,0x88e4);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBufferData() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b6d);
    (**(code **)(lVar4 + 0x15d0))
              ((this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>).
               super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.program_object_id,iVar2,0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glUniformBlockBinding() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b97);
    (**(code **)(lVar4 + 0x48))(0x8a11,0,buffer_object_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBindBufferBase() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x1b9a);
    if (tested_shader_type == COMPUTE_SHADER_TYPE) {
      execute_dispatch_test(this);
    }
    else {
      execute_draw_test(this,tested_shader_type);
    }
    (**(code **)(lVar4 + 0x438))(1,&buffer_object_id);
    (*(this->super_InteractionUniforms1<glcts::ArraysOfArrays::Interface::GL>).
      super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>.super_TestCase.super_TestNode.
      _vptr_TestNode[5])(this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uniform_use._M_dataplus._M_p != &uniform_use.field_2) {
      operator_delete(uniform_use._M_dataplus._M_p,
                      CONCAT71(uniform_use.field_2._M_allocated_capacity._1_7_,
                               uniform_use.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uniform_definition._M_dataplus._M_p != &uniform_definition.field_2) {
      operator_delete(uniform_definition._M_dataplus._M_p,
                      CONCAT71(uniform_definition.field_2._M_allocated_capacity._1_7_,
                               uniform_definition.field_2._M_local_buf[0]) + 1);
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == 4) {
      return;
    }
  }
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1bab);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InteractionUniformBuffers2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT,
															 VAR_TYPE_DOUBLE };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const glw::Functions&		gl			  = this->context_id.getRenderContext().getFunctions();
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	/* Iterate through float / int / uint values. */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string uniform_definition;
			std::string uniform_use;

			uniform_definition += "layout (std140) uniform uniform_block_name\n"
								  "{\n";
			uniform_definition += "    ";
			uniform_definition += var_iterator->second.type;
			uniform_definition += " my_uniform_1[1][1][1][1];\n"
								  "};\n";

			uniform_use = "    float result = float(my_uniform_1[0][0][0][0]);\n";

			if (API::USE_ALL_SHADER_STAGES)
			{
				const std::string& compute_shader_source =
					this->prepare_compute_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& fragment_shader_source =
					this->prepare_fragment_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& geometry_shader_source =
					this->prepare_geometry_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& tess_ctrl_shader_source =
					this->prepare_tess_ctrl_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& tess_eval_shader_source =
					this->prepare_tess_eval_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& vertex_shader_source =
					this->prepare_vertex_shader(tested_shader_type, uniform_definition, uniform_use);

				switch (tested_shader_type)
				{
				case TestCaseBase<API>::VERTEX_SHADER_TYPE: /* Fall through */
				case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
					this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
					break;

				case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
				case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
				case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: /* Fall through */
				case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
					this->execute_positive_test(vertex_shader_source, tess_ctrl_shader_source, tess_eval_shader_source,
												geometry_shader_source, fragment_shader_source, compute_shader_source,
												false, false);
					break;

				default:
					TCU_FAIL("Invalid enum");
					break;
				}
			}
			else
			{
				const std::string& fragment_shader_source =
					this->prepare_fragment_shader(tested_shader_type, uniform_definition, uniform_use);
				const std::string& vertex_shader_source =
					this->prepare_vertex_shader(tested_shader_type, uniform_definition, uniform_use);

				this->execute_positive_test(vertex_shader_source, fragment_shader_source, false, false);
			}

			glw::GLuint buffer_object_id	   = 0;
			glw::GLint  my_uniform_block_index = GL_INVALID_INDEX;

			gl.useProgram(this->program_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed.");

			my_uniform_block_index = gl.getUniformBlockIndex(this->program_object_id, "uniform_block_name");
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformBlockIndex() failed.");

			if ((unsigned)my_uniform_block_index == GL_INVALID_INDEX)
			{
				TCU_FAIL("Uniform block not found or is considered as not active.");
			}

			gl.genBuffers(1, &buffer_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed.");

			gl.bindBuffer(GL_UNIFORM_BUFFER, buffer_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed.");

			switch (var_type_index)
			{
			case 0: //float type of uniform is considered
			{
				glw::GLfloat buffer_data[] = { 0.0f, 1.0f, 2.0f,  3.0f,  4.0f,  5.0f,  6.0f,  7.0f,
											   8.0f, 9.0f, 10.0f, 11.0f, 12.0f, 13.0f, 14.0f, 15.0f };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			}		/* float case */
			case 1: //int type of uniform is considered
			{

				glw::GLint buffer_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			}		/* int case */
			case 2: //uint type of uniform is considered
			{
				glw::GLuint buffer_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			}		/* uint case */
			case 3: //double type of uniform is considered
			{
				glw::GLdouble buffer_data[] = { 0.0, 1.0, 2.0,  3.0,  4.0,  5.0,  6.0,  7.0,
												8.0, 9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0 };

				gl.bufferData(GL_UNIFORM_BUFFER, sizeof(buffer_data), buffer_data, GL_STATIC_DRAW);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

				break;
			} /* double case */
			default:
			{
				TCU_FAIL("Invalid variable-type index.");

				break;
			}
			} /* switch (var_type_index) */

			gl.uniformBlockBinding(this->program_object_id, my_uniform_block_index, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformBlockBinding() failed.");

			gl.bindBufferBase(GL_UNIFORM_BUFFER, 0, buffer_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed.");

			if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
			{
				execute_draw_test(tested_shader_type);
			}
			else
			{
				execute_dispatch_test();
			}

			/* Deallocate any resources used. */
			gl.deleteBuffers(1, &buffer_object_id);
			this->delete_objects();
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}